

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repack_script_text_translation.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *path;
  char *path_00;
  char *path_01;
  bool bVar1;
  int iVar2;
  undefined1 local_160 [8];
  Mzp translated_mzp;
  Mzp mzp;
  vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [8];
  string script_text_raw;
  string translation_db_raw;
  string mzp_out;
  json translation_db;
  
  if (argc == 4) {
    path = argv[1];
    path_00 = argv[2];
    path_01 = argv[3];
    script_text_raw._M_dataplus._M_p = (pointer)0x0;
    script_text_raw._M_string_length._0_1_ = 0;
    local_98 = (undefined1  [8])&script_text_raw._M_string_length;
    bVar1 = mg::fs::read_file(path_00,(string *)local_98);
    if (bVar1) {
      mzp.entry_data.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      mzp.entry_data.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      mzp.entry_headers.
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      mzp.entry_headers.
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mzp.header.magic[0] = '\0';
      mzp.header.magic[1] = '\0';
      mzp.header.magic[2] = '\0';
      mzp.header.magic[3] = '\0';
      mzp.header.magic[4] = '\0';
      mzp.header.magic[5] = '\0';
      mzp.header.archive_entry_count = 0;
      mzp.entry_headers.
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bVar1 = mg::data::mzp_read((string *)local_98,
                                 (Mzp *)&translated_mzp.entry_data.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        translation_db_raw._M_dataplus._M_p = (pointer)0x0;
        translation_db_raw._M_string_length._0_1_ = 0;
        script_text_raw.field_2._8_8_ = &translation_db_raw._M_string_length;
        bVar1 = mg::fs::read_file(path,(string *)((long)&script_text_raw.field_2 + 8));
        if (bVar1) {
          local_b8._M_unused._M_object = (void *)0x0;
          local_b8._8_8_ = 0;
          local_a8 = (code *)0x0;
          uStack_a0 = 0;
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::parse<std::__cxx11::string&>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)(mzp_out.field_2._M_local_buf + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&script_text_raw.field_2 + 8),(parser_callback_t *)&local_b8,true,false)
          ;
          if (local_a8 != (code *)0x0) {
            (*local_a8)(&local_b8,&local_b8,__destroy_functor);
          }
          mzp.entry_data.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               translated_mzp.entry_data.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::
          vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>::
          vector(&local_e8,
                 (vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                  *)&mzp);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_d0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&mzp.entry_headers.
                       super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          patch_string_table((Mzp *)local_160,(json *)((long)&mzp_out.field_2 + 8),
                             (Mzp *)&mzp.entry_data.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_d0);
          if (local_e8.
              super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.
                            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_e8.
                                  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_e8.
                                  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          mzp_out._M_dataplus._M_p = (pointer)0x0;
          mzp_out._M_string_length._0_1_ = 0;
          translation_db_raw.field_2._8_8_ = &mzp_out._M_string_length;
          mg::data::mzp_write((Mzp *)local_160,(string *)((long)&translation_db_raw.field_2 + 8));
          bVar1 = mg::fs::write_file(path_01,(string *)((long)&translation_db_raw.field_2 + 8));
          if ((size_type *)translation_db_raw.field_2._8_8_ != &mzp_out._M_string_length) {
            operator_delete((void *)translation_db_raw.field_2._8_8_,
                            CONCAT71(mzp_out._M_string_length._1_7_,
                                     (undefined1)mzp_out._M_string_length) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&translated_mzp.entry_headers.
                        super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (translated_mzp.header != (MzpArchiveHeader)0x0) {
            operator_delete((void *)translated_mzp.header,
                            (long)translated_mzp.entry_headers.
                                  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)translated_mzp.header);
          }
          iVar2 = bVar1 - 1;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)((long)&mzp_out.field_2 + 8));
        }
        else {
          fprintf(_stderr,"Failed to translation db from \'%s\'\n",path);
          iVar2 = -1;
        }
        if ((size_type *)script_text_raw.field_2._8_8_ != &translation_db_raw._M_string_length) {
          operator_delete((void *)script_text_raw.field_2._8_8_,
                          CONCAT71(translation_db_raw._M_string_length._1_7_,
                                   (undefined1)translation_db_raw._M_string_length) + 1);
        }
      }
      else {
        main_cold_2();
        iVar2 = -1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mzp.entry_headers.
                    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (mzp.header != (MzpArchiveHeader)0x0) {
        operator_delete((void *)mzp.header,
                        (long)mzp.entry_headers.
                              super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)mzp.header);
      }
    }
    else {
      fprintf(_stderr,"Failed to read script text from \'%s\'\n",path_00);
      iVar2 = -1;
    }
    if (local_98 != (undefined1  [8])&script_text_raw._M_string_length) {
      operator_delete((void *)local_98,
                      CONCAT71(script_text_raw._M_string_length._1_7_,
                               (undefined1)script_text_raw._M_string_length) + 1);
    }
  }
  else {
    main_cold_1();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 4) {
    fprintf(stderr, "%s translation_db.json script_in.mrg script_out.mrg\n",
            argv[0]);
    return -1;
  }

  // Name args
  const char *translation_db_filename = argv[1];
  const char *input_mrg = argv[2];
  const char *output_mrg = argv[3];

  // Try and load input script text
  std::string script_text_raw;
  if (!mg::fs::read_file(input_mrg, script_text_raw)) {
    fprintf(stderr, "Failed to read script text from '%s'\n", input_mrg);
    return -1;
  }

  // Attempt to parse script text as MZP archive
  mg::data::Mzp mzp;
  if (!mg::data::mzp_read(script_text_raw, mzp)) {
    fprintf(stderr, "Failed to parse script data as MZP\n");
    return -1;
  }

  // Try and load the translation DB
  std::string translation_db_raw;
  if (!mg::fs::read_file(translation_db_filename, translation_db_raw)) {
    fprintf(stderr, "Failed to translation db from '%s'\n",
            translation_db_filename);
    return -1;
  }
  nlohmann::json translation_db = nlohmann::json::parse(translation_db_raw);

  // Retranslate the script
  mg::data::Mzp translated_mzp = patch_string_table(translation_db, mzp);

  // Write out the translated archive
  std::string mzp_out;
  mg::data::mzp_write(translated_mzp, mzp_out);
  if (!mg::fs::write_file(output_mrg, mzp_out)) {
    return -1;
  }

  return 0;
}